

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv2d.cpp
# Opt level: O0

void benchmark<float>(size_t num_channels,size_t num_outputs,size_t num_images)

{
  uint uVar1;
  ostream *this;
  long lVar2;
  reference pvVar3;
  long lVar4;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  size_t j_1;
  size_t i_1;
  size_t j;
  size_t i;
  size_t im;
  vector<float,_remora::cpu_tag> filter;
  matrix<float,_remora::row_major,_remora::cpu_tag> image;
  size_t sizeIm2;
  size_t sizeIm1;
  size_t sizeOut2;
  size_t sizeOut1;
  size_t iter;
  size_t filterSize;
  matrix<float,_remora::row_major,_remora::cpu_tag> *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff30;
  reference in_stack_ffffffffffffff38;
  matrix<float,_remora::row_major,_remora::cpu_tag> *in_stack_ffffffffffffff40;
  size_type in_stack_ffffffffffffff48;
  matrix<float,_remora::row_major,_remora::cpu_tag> *in_stack_ffffffffffffff50;
  long local_a8;
  long local_a0;
  long local_28;
  matrix<float,_remora::row_major,_remora::cpu_tag> *local_20;
  
  this = std::operator<<((ostream *)&std::cout,"Flops");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  for (local_20 = (matrix<float,_remora::row_major,_remora::cpu_tag> *)0x4;
      local_20 != (matrix<float,_remora::row_major,_remora::cpu_tag> *)0x20;
      local_20 = (matrix<float,_remora::row_major,_remora::cpu_tag> *)((long)local_20 << 1)) {
    for (local_28 = 0; local_28 != 5; local_28 = local_28 + 1) {
      lVar4 = (long)(int)((2 << ((byte)local_28 & 0x1f)) << 4 | 3);
      uVar1 = (2 << ((byte)local_28 & 0x1f)) << 4 | 3;
      remora::matrix<float,_remora::row_major,_remora::cpu_tag>::matrix
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                 (size_type)in_stack_ffffffffffffff40);
      remora::vector<float,_remora::cpu_tag>::vector
                ((vector<float,_remora::cpu_tag> *)in_stack_ffffffffffffff50,
                 in_stack_ffffffffffffff48);
      for (local_a0 = 0; local_a0 != in_RDX; local_a0 = local_a0 + 1) {
        for (local_a8 = 0; local_a8 != in_RDI * (lVar4 + -1 + (long)local_20);
            local_a8 = local_a8 + 1) {
          for (in_stack_ffffffffffffff50 = (matrix<float,_remora::row_major,_remora::cpu_tag> *)0x0;
              in_stack_ffffffffffffff50 !=
              (matrix<float,_remora::row_major,_remora::cpu_tag> *)
              ((long)(int)uVar1 + -1 + (long)local_20);
              in_stack_ffffffffffffff50 =
                   (matrix<float,_remora::row_major,_remora::cpu_tag> *)
                   ((long)&in_stack_ffffffffffffff50->m_size1 + 1)) {
            lVar2 = in_RDI * lVar4;
            auVar6._8_4_ = (int)((ulong)lVar2 >> 0x20);
            auVar6._0_8_ = lVar2;
            auVar6._12_4_ = 0x45300000;
            auVar7._8_4_ = (int)((ulong)local_a8 >> 0x20);
            auVar7._0_8_ = local_a8;
            auVar7._12_4_ = 0x45300000;
            auVar10._8_4_ = (int)uVar1 >> 0x1f;
            auVar10._0_8_ = (long)(int)uVar1;
            auVar10._12_4_ = 0x45300000;
            auVar11._8_4_ = (int)((ulong)in_stack_ffffffffffffff50 >> 0x20);
            auVar11._0_8_ = in_stack_ffffffffffffff50;
            auVar11._12_4_ = 0x45300000;
            fVar5 = (float)(((1.0 / ((auVar6._8_8_ - 1.9342813113834067e+25) +
                                    ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)))
                             * ((auVar7._8_8_ - 1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,(int)local_a8) - 4503599627370496.0)) +
                            0.1) - (0.1 / ((auVar10._8_8_ - 1.9342813113834067e+25) +
                                          ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0))
                                   ) * ((auVar11._8_8_ - 1.9342813113834067e+25) +
                                       ((double)CONCAT44(0x43300000,(int)in_stack_ffffffffffffff50)
                                       - 4503599627370496.0)));
            in_stack_ffffffffffffff38 =
                 remora::matrix<float,_remora::row_major,_remora::cpu_tag>::operator()
                           (in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38,
                            CONCAT44(fVar5,in_stack_ffffffffffffff30));
            *in_stack_ffffffffffffff38 = fVar5;
          }
        }
      }
      for (in_stack_ffffffffffffff48 = 0;
          in_stack_ffffffffffffff48 != in_RDI * in_RSI * (long)local_20;
          in_stack_ffffffffffffff48 = in_stack_ffffffffffffff48 + 1) {
        for (in_stack_ffffffffffffff40 = (matrix<float,_remora::row_major,_remora::cpu_tag> *)0x0;
            in_stack_ffffffffffffff40 != local_20;
            in_stack_ffffffffffffff40 =
                 (matrix<float,_remora::row_major,_remora::cpu_tag> *)
                 ((long)&in_stack_ffffffffffffff40->m_size1 + 1)) {
          lVar4 = in_RDI * (long)local_20;
          auVar8._8_4_ = (int)((ulong)lVar4 >> 0x20);
          auVar8._0_8_ = lVar4;
          auVar8._12_4_ = 0x45300000;
          auVar9._8_4_ = (int)(in_stack_ffffffffffffff48 >> 0x20);
          auVar9._0_8_ = in_stack_ffffffffffffff48;
          auVar9._12_4_ = 0x45300000;
          auVar12._8_4_ = (int)((ulong)local_20 >> 0x20);
          auVar12._0_8_ = local_20;
          auVar12._12_4_ = 0x45300000;
          auVar13._8_4_ = (int)((ulong)in_stack_ffffffffffffff40 >> 0x20);
          auVar13._0_8_ = in_stack_ffffffffffffff40;
          auVar13._12_4_ = 0x45300000;
          fVar5 = (float)(((1.0 / ((auVar8._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0))) *
                           ((auVar9._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)in_stack_ffffffffffffff48) -
                           4503599627370496.0)) + 0.1) -
                         (0.1 / ((auVar12._8_8_ - 1.9342813113834067e+25) +
                                ((double)CONCAT44(0x43300000,(int)local_20) - 4503599627370496.0)))
                         * ((auVar13._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)in_stack_ffffffffffffff40) -
                           4503599627370496.0)));
          pvVar3 = remora::vector<float,_remora::cpu_tag>::operator()
                             ((vector<float,_remora::cpu_tag> *)
                              CONCAT44(fVar5,in_stack_ffffffffffffff20),
                              (size_type)in_stack_ffffffffffffff18);
          *pvVar3 = fVar5;
        }
      }
      in_stack_ffffffffffffff18 = local_20;
      benchmark<remora::matrix<float,remora::row_major,remora::cpu_tag>,remora::vector<float,remora::cpu_tag>>
                ((matrix_expression<remora::matrix<float,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                  *)image.m_data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish,
                 (vector_expression<remora::vector<float,_remora::cpu_tag>,_remora::cpu_tag> *)
                 image.m_data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,image.m_size2,image.m_size1,
                 (size_t)filter.m_storage.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,
                 (size_t)filter.m_storage.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_finish,sizeIm2);
      remora::vector<float,_remora::cpu_tag>::~vector((vector<float,_remora::cpu_tag> *)0x1097e7);
      remora::matrix<float,_remora::row_major,_remora::cpu_tag>::~matrix
                ((matrix<float,_remora::row_major,_remora::cpu_tag> *)0x1097f1);
    }
  }
  return;
}

Assistant:

void benchmark(std::size_t num_channels, std::size_t num_outputs, std::size_t num_images){
	std::cout<<"Flops"<<std::endl;
	for(std::size_t filterSize = 4; filterSize != 32; filterSize *= 2){
		for(std::size_t iter = 0; iter != 5; ++iter){
			std::size_t sizeOut1 = 3+16 * (2<<iter);
			std::size_t sizeOut2 = 3+16 * (2<<iter);
			std::size_t sizeIm1 = sizeOut1 + filterSize-1;
			std::size_t sizeIm2 = sizeOut2 + filterSize-1;

			remora::matrix<T> image(num_images, num_channels * sizeIm1 * sizeIm2);
			remora::vector<T> filter(num_channels * num_outputs *  filterSize * filterSize);
			
			for(std::size_t im = 0; im != num_images; ++im){
				for(std::size_t i = 0; i != num_channels * sizeIm1; ++i){
					for(std::size_t j = 0; j != sizeIm2; ++j){
						image(im, i * sizeIm2 + j)  = 1.0/(num_channels * sizeOut1)*i + 0.1 - (0.1/sizeOut2)*j;
					}
				}
			}
			for(std::size_t i = 0; i != num_channels * num_outputs * filterSize; ++i){
				for(std::size_t j = 0; j != filterSize; ++j){
					filter(i * filterSize + j)  = 1.0/(num_channels * filterSize)*i + 0.1 - (0.1/filterSize)*j;
				}
			}

			benchmark(image,filter,num_channels,num_outputs, sizeIm1, sizeIm2, filterSize);
		}
	}
}